

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChMatterSPH::VariablesQbSetSpeed(ChMatterSPH *this,double step)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  pointer psVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  ChVector<double> local_98;
  ChVectorRef local_80;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_68;
  ChVectorRef *local_50;
  undefined8 local_48;
  long local_38;
  
  psVar5 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar5) {
    uVar6 = 1;
    uVar7 = 0;
    dVar8 = 1.0 / step;
    do {
      peVar3 = psVar5[uVar7].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      auVar4 = *(undefined1 (*) [16])(peVar3->super_ChNodeXYZ).pos_dt.m_data;
      dVar1 = (peVar3->super_ChNodeXYZ).pos_dt.m_data[2];
      ChVariables::Get_qb(&local_80,&(peVar3->variables).super_ChVariables);
      local_68._0_8_ =
           local_80.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ._0_8_;
      local_68._8_8_ = 3;
      local_48 = 0;
      local_38 = local_80.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_;
      local_50 = &local_80;
      if ((long)local_80.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 3) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_98,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_68,(type *)0x0);
      if (&(peVar3->super_ChNodeXYZ).pos_dt != &local_98) {
        (peVar3->super_ChNodeXYZ).pos_dt.m_data[0] = local_98.m_data[0];
        (peVar3->super_ChNodeXYZ).pos_dt.m_data[1] = local_98.m_data[1];
        (peVar3->super_ChNodeXYZ).pos_dt.m_data[2] = local_98.m_data[2];
      }
      psVar5 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((step != 0.0) || (NAN(step))) {
        peVar3 = psVar5[uVar7].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        dVar2 = (peVar3->super_ChNodeXYZ).pos_dt.m_data[2];
        auVar4 = vsubpd_avx(*(undefined1 (*) [16])(peVar3->super_ChNodeXYZ).pos_dt.m_data,auVar4);
        (peVar3->super_ChNodeXYZ).pos_dtdt.m_data[0] = auVar4._0_8_ * dVar8;
        (peVar3->super_ChNodeXYZ).pos_dtdt.m_data[1] = auVar4._8_8_ * dVar8;
        (peVar3->super_ChNodeXYZ).pos_dtdt.m_data[2] = (dVar2 - dVar1) * dVar8;
      }
      uVar7 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar7 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4));
  }
  return;
}

Assistant:

void ChMatterSPH::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        ChVector<> old_pos_dt = nodes[j]->GetPos_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        nodes[j]->SetPos_dt(nodes[j]->variables.Get_qb().segment(0, 3));

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            nodes[j]->SetPos_dtdt((nodes[j]->GetPos_dt() - old_pos_dt) / step);
        }
    }
}